

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticFundamentalParameterData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::
UnderwaterAcousticFundamentalParameterData
          (UnderwaterAcousticFundamentalParameterData *this,ActiveEmissionParameterIndex AEPI,
          ScanPattern SP,KFLOAT32 BeamCenterAzimuth,KFLOAT32 AzimuthalBeamwidth,KFLOAT32 BeamCenter,
          KFLOAT32 BeamWidth)

{
  KFLOAT32 BeamWidth_local;
  KFLOAT32 BeamCenter_local;
  KFLOAT32 AzimuthalBeamwidth_local;
  KFLOAT32 BeamCenterAzimuth_local;
  ScanPattern SP_local;
  ActiveEmissionParameterIndex AEPI_local;
  UnderwaterAcousticFundamentalParameterData *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__UnderwaterAcousticFundamentalParameterData_0032f7b0;
  this->m_ui16AEPI = (KUINT16)AEPI;
  this->m_ui16ScanPattern = (KUINT16)SP;
  this->m_f32BeamCenterAzimuth = BeamCenterAzimuth;
  this->m_f32AzimuthalBeamWidth = AzimuthalBeamwidth;
  this->m_f32BeamCenterDE = BeamCenter;
  this->m_f32DEBeamwidth = BeamWidth;
  return;
}

Assistant:

UnderwaterAcousticFundamentalParameterData::UnderwaterAcousticFundamentalParameterData( ActiveEmissionParameterIndex AEPI, ScanPattern SP, KFLOAT32 BeamCenterAzimuth,
        KFLOAT32 AzimuthalBeamwidth, KFLOAT32 BeamCenter, KFLOAT32 BeamWidth ) :
    m_ui16AEPI( AEPI ),
    m_ui16ScanPattern( SP ),
    m_f32BeamCenterAzimuth( BeamCenterAzimuth ),
    m_f32AzimuthalBeamWidth( AzimuthalBeamwidth ),
    m_f32BeamCenterDE( BeamCenter ),
    m_f32DEBeamwidth( BeamWidth )
{
}